

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::PatchPutValueWithThisPtrCheckLayout<Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  bool bVar1;
  DynamicObject *pDVar2;
  DynamicTypeHandler *oldTypeHandler;
  
  bVar1 = VarIs<Js::DynamicObject>(instance);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    oldTypeHandler = DynamicObject::GetTypeHandler(pDVar2);
  }
  else {
    oldTypeHandler = (DynamicTypeHandler *)0x0;
  }
  PatchPutValueWithThisPtr<true,Js::PolymorphicInlineCache>
            (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,thisInstance,
             flags);
  if (oldTypeHandler != (DynamicTypeHandler *)0x0) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    bVar1 = LayoutChanged(pDVar2,oldTypeHandler);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool JavascriptOperators::PatchPutValueWithThisPtrCheckLayout(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueWithThisPtrCheckLayout);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchPutValueWithThisPtrCheckLayout, Op_PatchPutValueWithThisPtr);

        DynamicTypeHandler * oldTypeHandler = VarIs<DynamicObject>(instance) ? UnsafeVarTo<DynamicObject>(instance)->GetTypeHandler() : nullptr;
        PatchPutValueWithThisPtr<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, newValue, thisInstance, flags);
        return (oldTypeHandler != nullptr && LayoutChanged(UnsafeVarTo<DynamicObject>(instance), oldTypeHandler));

        JIT_HELPER_END(Op_PatchPutValueWithThisPtrCheckLayout);
    }